

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

EVaction INT_EVassoc_congestion_action
                   (CManager_conflict cm,EVstone stone_num,char *action_spec,void *client_data)

{
  void **ppvVar1;
  undefined8 *puVar2;
  attr_list *pp_Var3;
  FMFormat **ref_ptr;
  FILE *__stream;
  int iVar4;
  __pid_t _Var5;
  stone_type stone;
  pthread_t pVar6;
  _proto_action *p_Var7;
  EVSimpleHandlerFunc p_Var8;
  uint uVar9;
  long lVar10;
  timespec ts;
  timespec local_40;
  
  stone = stone_struct(cm->evp,stone_num);
  if (stone == (stone_type)0x0) {
    uVar9 = 0xffffffff;
  }
  else {
    uVar9 = stone->proto_action_count;
    lVar10 = (long)(int)uVar9;
    iVar4 = CMtrace_val[10];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        __stream = (FILE *)cm->CMTrace_file;
        _Var5 = getpid();
        pVar6 = pthread_self();
        fprintf(__stream,"P%lxT%lx - ",(long)_Var5,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_40);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"Adding Congestion action %d to stone %x\n",(ulong)uVar9,
              stone_num);
    }
    fflush((FILE *)cm->CMTrace_file);
    p_Var7 = (_proto_action *)INT_CMrealloc(stone->proto_actions,lVar10 * 0x60 + 0x60);
    stone->proto_actions = p_Var7;
    *(undefined8 *)(p_Var7 + lVar10) = 0;
    p_Var7[lVar10].input_format_requirements = (FMStructDescList)0x0;
    p_Var7[lVar10].matching_reference_formats = (FMFormat *)0x0;
    (((anon_union_48_6_c1ce387a_for_o *)(&p_Var7[lVar10].matching_reference_formats + 1))->term).
    handler = (EVSimpleHandlerFunc)0x0;
    ppvVar1 = &p_Var7[lVar10].o.term.client_data;
    *ppvVar1 = (void *)0x0;
    ppvVar1[1] = (void *)0x0;
    puVar2 = (undefined8 *)((long)&p_Var7[lVar10].o + 0x18);
    *puVar2 = 0;
    puVar2[1] = 0;
    pp_Var3 = &p_Var7[lVar10].o.bri.remote_contact;
    *pp_Var3 = (attr_list)0x0;
    pp_Var3[1] = (attr_list)0x0;
    p_Var7[lVar10].attrs = (attr_list)0x0;
    (&p_Var7[lVar10].attrs)[1] = (attr_list)0x0;
    ref_ptr = &stone->proto_actions[lVar10].matching_reference_formats;
    *(encode_state *)(ref_ptr + 7) = Requires_Decoded;
    ((_proto_action *)(ref_ptr + -2))->action_type = Action_Congestion;
    p_Var8 = (EVSimpleHandlerFunc)
             install_response_handler(cm,stone_num,action_spec,client_data,ref_ptr);
    stone->proto_actions[lVar10].o.term.handler = p_Var8;
    stone->proto_action_count = stone->proto_action_count + 1;
    stone->response_cache_count = 0;
    if (stone->response_cache != (response_cache_element *)0x0) {
      free_response_cache(stone);
    }
    stone->response_cache = (response_cache_element *)0x0;
  }
  return uVar9;
}

Assistant:

EVaction
INT_EVassoc_congestion_action(CManager cm, EVstone stone_num, 
			      char *action_spec, void *client_data)
{
#ifdef HAVE_COD_H
    event_path_data evp = cm->evp;
    int action_num;
    stone_type stone;

    stone = stone_struct(evp, stone_num);
    if (!stone) return -1;

    action_num = stone->proto_action_count;
    CMtrace_out(cm, EVerbose, "Adding Congestion action %d to stone %x\n",
		action_num, stone_num);
    stone->proto_actions = realloc(stone->proto_actions, (action_num + 1) * 
				   sizeof(stone->proto_actions[0]));
    memset(&stone->proto_actions[action_num], 0, sizeof(stone->proto_actions[0]));
    stone->proto_actions[action_num].data_state = Requires_Decoded;
    stone->proto_actions[action_num].action_type = Action_Congestion;
    stone->proto_actions[action_num].o.imm.mutable_response_data = 
 	install_response_handler(cm, stone_num, action_spec, client_data, 
				 &stone->proto_actions[action_num].matching_reference_formats);
    stone->proto_action_count++;
    clear_response_cache(stone);
    return action_num;
#else
    fprintf(stderr, "No code generation in FFS, action unavailable\n");
    return -1;
#endif    
}